

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O3

void makeTiled(char *inFileName,char *outFileName,int partnum,LevelMode mode,
              LevelRoundingMode roundingMode,Compression compression,int tileSizeX,int tileSizeY,
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *doNotFilter,Extrapolation extX,Extrapolation extY,bool verbose)

{
  _Base_ptr p_Var1;
  string *name;
  _Base_ptr p_Var2;
  size_type __n;
  pointer pHVar3;
  pointer pHVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  Header *pHVar11;
  Box2i *dataWindow;
  _Rb_tree_node_base *p_Var12;
  _Rb_tree_node_base *p_Var13;
  ImageChannel *pIVar14;
  long lVar15;
  undefined4 *puVar16;
  long *plVar17;
  ChannelList *pCVar18;
  ostream *poVar19;
  char *pcVar20;
  InputExc *this;
  NoImplExc *this_00;
  bool odd;
  ulong *puVar21;
  int y;
  LevelMode lx;
  int x;
  int iVar22;
  undefined8 uVar23;
  Image *image0_00;
  Image *image;
  undefined1 auVar24 [12];
  InputPart in;
  Image *iptr1;
  Header h;
  DeepTiledInputPart in_1;
  MultiPartInputFile input;
  MultiPartOutputFile output;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  Header header;
  Image image0;
  FrameBuffer fb;
  Image image1;
  Image image2;
  Image *local_258;
  string local_250;
  char *local_230;
  undefined1 local_228 [24];
  undefined1 local_210 [24];
  long lStack_1f8;
  string local_1d8;
  MultiPartInputFile local_1b8 [16];
  char *local_1a8;
  char *local_1a0;
  string local_198;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> local_178;
  char *local_160;
  TileDescription local_158 [3];
  Image local_120;
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  local_e0;
  Image local_b0;
  Image local_70;
  
  local_1a0 = (char *)CONCAT44(local_1a0._4_4_,compression);
  local_230 = (char *)CONCAT44(local_230._4_4_,roundingMode);
  local_228._12_4_ = partnum;
  local_160 = outFileName;
  Image::Image(&local_120);
  Image::Image(&local_b0);
  Image::Image(&local_70);
  local_210._0_8_ = (_Base_ptr)0x0;
  Imf_3_2::Header::Header
            ((Header *)local_158,0x40,0x40,1.0,(Vec2 *)(local_228 + 0x18),1.0,INCREASING_Y,
             ZIP_COMPRESSION);
  local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e0._M_impl.super__Rb_tree_header._M_header;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (Header *)0x0;
  local_178.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar6 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_1b8,inFileName,iVar6,true);
  local_228._16_4_ = Imf_3_2::MultiPartInputFile::parts();
  if (0 < (int)local_228._16_4_) {
    p_Var2 = (_Base_ptr)(local_210 + 0x10);
    uVar7 = 0;
    name = (string *)(local_228 + 0x18);
    local_1a8 = inFileName;
    do {
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"reading file ",0xd);
        if (inFileName == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x110278);
        }
        else {
          sVar10 = strlen(inFileName);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,inFileName,sVar10);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
      }
      if (uVar7 == local_228._12_4_) {
        Imf_3_2::InputPart::InputPart((InputPart *)local_228,local_1b8,local_228._12_4_);
        pHVar11 = (Header *)Imf_3_2::InputPart::header();
        Imf_3_2::Header::operator=((Header *)local_158,pHVar11);
        cVar5 = Imf_3_2::hasEnvmap((Header *)local_158);
        if (cVar5 == '\x01' && mode != ONE_LEVEL) {
          this_00 = (NoImplExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::NoImplExc::NoImplExc
                    (this_00,
                     "This program cannot generate multiresolution environment maps.  Use exrenvmap instead."
                    );
          __cxa_throw(this_00,&Iex_3_2::NoImplExc::typeinfo,Iex_3_2::NoImplExc::~NoImplExc);
        }
        dataWindow = (Box2i *)Imf_3_2::Header::dataWindow();
        Image::resize(&local_120,dataWindow);
        Imf_3_2::Header::channels();
        p_Var12 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
        while( true ) {
          Imf_3_2::Header::channels();
          p_Var13 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
          if (p_Var12 == p_Var13) break;
          if ((*(int *)&p_Var12[9].field_0x4 != 1) || (*(int *)&p_Var12[9]._M_parent != 1)) {
            this = (InputExc *)__cxa_allocate_exception(0x48);
            Iex_3_2::InputExc::InputExc
                      (this,"Sub-sampled image channels are not supported in tiled files.");
            __cxa_throw(this,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
          }
          p_Var13 = p_Var12 + 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)name,(char *)p_Var13,(allocator<char> *)&local_250);
          Image::addChannel(&local_120,name,p_Var12[9]._M_color);
          if ((_Base_ptr)local_210._0_8_ != p_Var2) {
            operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)name,(char *)p_Var13,(allocator<char> *)&local_250);
          Image::addChannel(&local_b0,name,p_Var12[9]._M_color);
          if ((_Base_ptr)local_210._0_8_ != p_Var2) {
            operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)name,(char *)p_Var13,(allocator<char> *)&local_250);
          Image::addChannel(&local_70,name,p_Var12[9]._M_color);
          if ((_Base_ptr)local_210._0_8_ != p_Var2) {
            operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_250,(char *)p_Var13,(allocator<char> *)&local_198);
          pIVar14 = Image::channel(&local_120,&local_250);
          (*pIVar14->_vptr_ImageChannel[2])(name,pIVar14);
          Imf_3_2::FrameBuffer::insert((char *)&local_e0,(Slice *)p_Var13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
        }
        Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)local_228);
        lVar15 = Imf_3_2::Header::dataWindow();
        iVar6 = *(int *)(lVar15 + 4);
        Imf_3_2::Header::dataWindow();
        Imf_3_2::InputPart::readPixels((int)local_228,iVar6);
        local_210._4_4_ = tileSizeY;
        local_210._0_4_ = tileSizeX;
        local_210._12_4_ = local_230._0_4_;
        local_210._8_4_ = mode;
        Imf_3_2::Header::setTileDescription(local_158);
        puVar16 = (undefined4 *)Imf_3_2::Header::compression();
        *puVar16 = local_1a0._0_4_;
        auVar24 = Imf_3_2::Header::lineOrder();
        *auVar24._0_8_ = 0;
        if (mode != ONE_LEVEL) {
          (anonymous_namespace)::extToString_abi_cxx11_
                    (&local_198,(_anonymous_namespace_ *)(ulong)extX,auVar24._8_4_);
          plVar17 = (long *)std::__cxx11::string::append((char *)&local_198);
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          puVar21 = (ulong *)(plVar17 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar21) {
            local_250.field_2._M_allocated_capacity = *puVar21;
            local_250.field_2._8_8_ = plVar17[3];
          }
          else {
            local_250.field_2._M_allocated_capacity = *puVar21;
            local_250._M_dataplus._M_p = (pointer)*plVar17;
          }
          local_250._M_string_length = plVar17[1];
          *plVar17 = (long)puVar21;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          (anonymous_namespace)::extToString_abi_cxx11_
                    (&local_1d8,(_anonymous_namespace_ *)(ulong)extY,
                     (Extrapolation)local_250._M_string_length);
          uVar23 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            uVar23 = local_250.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar23 < local_1d8._M_string_length + local_250._M_string_length) {
            uVar23 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              uVar23 = local_1d8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar23 < local_1d8._M_string_length + local_250._M_string_length)
            goto LAB_00106f04;
            plVar17 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_1d8,0,(char *)0x0,
                                         (ulong)local_250._M_dataplus._M_p);
          }
          else {
LAB_00106f04:
            plVar17 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_250,(ulong)local_1d8._M_dataplus._M_p);
          }
          p_Var1 = (_Base_ptr)(plVar17 + 2);
          if ((_Base_ptr)*plVar17 == p_Var1) {
            local_210._16_8_ = *(undefined8 *)p_Var1;
            lStack_1f8 = plVar17[3];
            local_210._0_8_ = p_Var2;
          }
          else {
            local_210._16_8_ = *(undefined8 *)p_Var1;
            local_210._0_8_ = (_Base_ptr)*plVar17;
          }
          local_210._8_8_ = plVar17[1];
          *plVar17 = (long)p_Var1;
          plVar17[1] = 0;
          *(undefined1 *)&p_Var1->_M_color = _S_red;
          Imf_3_2::addWrapmodes((Header *)local_158,(string *)name);
          if ((_Base_ptr)local_210._0_8_ != p_Var2) {
            operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
        }
        Imf_3_2::Header::setType((string *)local_158);
        Imf_3_2::getChunkOffsetTableSize((Header *)local_158);
        Imf_3_2::Header::setChunkCount((int)local_158);
        std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                  (&local_178,(value_type *)local_158);
        inFileName = local_1a8;
      }
      else {
        pHVar11 = (Header *)Imf_3_2::MultiPartInputFile::header((int)local_1b8);
        Imf_3_2::Header::Header((Header *)name,pHVar11);
        std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                  (&local_178,(value_type *)name);
        Imf_3_2::Header::~Header((Header *)name);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_228._16_4_);
  }
  pHVar4 = local_178.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pHVar3 = local_178.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar6 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
            ((MultiPartOutputFile *)&local_198,local_160,pHVar3,
             (int)((ulong)((long)pHVar4 - (long)pHVar3) >> 3) * -0x49249249,false,iVar6);
  if (0 < (int)local_228._16_4_) {
    local_1a0 = (char *)(ulong)(uint)local_228._12_4_;
    local_1a8 = (char *)(local_228._16_8_ & 0xffffffff);
    pcVar20 = (char *)0x0;
    do {
      local_230 = pcVar20;
      if (pcVar20 == local_1a0) {
        Imf_3_2::TiledOutputPart::TiledOutputPart
                  ((TiledOutputPart *)&local_250,(MultiPartOutputFile *)&local_198,local_228._12_4_)
        ;
        Imf_3_2::TiledOutputPart::setFrameBuffer((FrameBuffer *)&local_250);
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"writing file ",0xd);
          pcVar20 = local_160;
          if (local_160 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x110278);
          }
          else {
            sVar10 = strlen(local_160);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar20,sVar10)
            ;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\nlevel (0, 0)",0xd);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          std::ostream::flush();
        }
        iVar6 = 0;
        while( true ) {
          iVar22 = (int)&local_250;
          iVar8 = Imf_3_2::TiledOutputPart::numYTiles(iVar22);
          if (iVar8 <= iVar6) break;
          for (iVar8 = 0; iVar9 = Imf_3_2::TiledOutputPart::numXTiles(iVar22), iVar8 < iVar9;
              iVar8 = iVar8 + 1) {
            Imf_3_2::TiledOutputPart::writeTile(iVar22,iVar8,iVar6);
          }
          iVar6 = iVar6 + 1;
        }
        lx = mode;
        if (mode == MIPMAP_LEVELS) {
          for (; iVar6 = Imf_3_2::TiledOutputPart::numLevels(), (int)lx < iVar6;
              lx = lx + MIPMAP_LEVELS) {
            Imf_3_2::TiledOutputPart::dataWindowForLevel((int)(Box2i *)(local_228 + 0x18),iVar22);
            Image::resize(&local_b0,(Box2i *)(local_228 + 0x18));
            pCVar18 = (ChannelList *)Imf_3_2::Header::channels();
            odd = (bool)((byte)lx & 1);
            anon_unknown.dwarf_1e376::reduceX(pCVar18,doNotFilter,extX,odd,&local_120,&local_b0);
            Imf_3_2::TiledOutputPart::dataWindowForLevel((int)(Box2i *)(local_228 + 0x18),iVar22);
            Image::resize(&local_120,(Box2i *)(local_228 + 0x18));
            pCVar18 = (ChannelList *)Imf_3_2::Header::channels();
            anon_unknown.dwarf_1e376::reduceY(pCVar18,doNotFilter,extY,odd,&local_b0,&local_120);
            if (verbose) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"level (",7);
              poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,lx);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
              poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,lx);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,")",1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
              std::ostream::put((char)poVar19);
              std::ostream::flush();
            }
            pCVar18 = (ChannelList *)Imf_3_2::Header::channels();
            anon_unknown.dwarf_1e376::storeLevel
                      ((TiledOutputPart *)&local_250,pCVar18,lx,lx,&local_120);
          }
        }
        else if (mode == RIPMAP_LEVELS) {
          local_228._16_8_ = &local_b0;
          image0_00 = &local_120;
          local_258 = &local_70;
          for (iVar6 = 0; iVar8 = Imf_3_2::TiledOutputPart::numYLevels(), iVar6 < iVar8;
              iVar6 = iVar6 + 1) {
            iVar8 = Imf_3_2::TiledOutputPart::numYLevels();
            if (iVar6 < iVar8 + -1) {
              Imf_3_2::TiledOutputPart::dataWindowForLevel((int)(Box2i *)(local_228 + 0x18),iVar22);
              Image::resize(local_258,(Box2i *)(local_228 + 0x18));
              pCVar18 = (ChannelList *)Imf_3_2::Header::channels();
              anon_unknown.dwarf_1e376::reduceY
                        (pCVar18,doNotFilter,extY,(bool)((byte)iVar6 & 1),image0_00,local_258);
            }
            iVar8 = 0;
            image = image0_00;
            while (iVar9 = Imf_3_2::TiledOutputPart::numXLevels(), iVar8 < iVar9) {
              if (iVar8 != 0 || iVar6 != 0) {
                if (verbose) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"level (",7);
                  poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
                  poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,iVar6);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar19,")",1);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
                  std::ostream::put((char)poVar19);
                  std::ostream::flush();
                }
                pCVar18 = (ChannelList *)Imf_3_2::Header::channels();
                anon_unknown.dwarf_1e376::storeLevel
                          ((TiledOutputPart *)&local_250,pCVar18,iVar8,iVar6,image);
              }
              iVar9 = Imf_3_2::TiledOutputPart::numXLevels();
              if (iVar8 < iVar9 + -1) {
                Imf_3_2::TiledOutputPart::dataWindowForLevel
                          ((int)(Box2i *)(local_228 + 0x18),iVar22);
                Image::resize((Image *)local_228._16_8_,(Box2i *)(local_228 + 0x18));
                pCVar18 = (ChannelList *)Imf_3_2::Header::channels();
                uVar23 = local_228._16_8_;
                anon_unknown.dwarf_1e376::reduceX
                          (pCVar18,doNotFilter,extX,(bool)((byte)iVar8 & 1),image,
                           (Image *)local_228._16_8_);
                local_228._16_8_ = image;
                iVar8 = iVar8 + 1;
                image = (Image *)uVar23;
              }
              else {
                iVar8 = iVar8 + 1;
              }
            }
            image0_00 = local_258;
            local_258 = image;
          }
        }
      }
      else {
        Imf_3_2::Header::Header
                  ((Header *)(local_228 + 0x18),
                   local_178.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                   _M_impl.super__Vector_impl_data._M_start + (long)pcVar20 * 0x38);
        plVar17 = (long *)Imf_3_2::Header::type_abi_cxx11_();
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_250,*plVar17,plVar17[1] + *plVar17);
        __n = local_250._M_string_length;
        if ((local_250._M_string_length == DAT_0010f448) &&
           ((local_250._M_string_length == 0 ||
            (iVar6 = bcmp(local_250._M_dataplus._M_p,Imf_3_2::TILEDIMAGE_abi_cxx11_,
                          local_250._M_string_length), iVar6 == 0)))) {
          iVar6 = (int)local_230;
          Imf_3_2::TiledInputPart::TiledInputPart((TiledInputPart *)&local_1d8,local_1b8,iVar6);
          Imf_3_2::TiledOutputPart::TiledOutputPart
                    ((TiledOutputPart *)local_228,(MultiPartOutputFile *)&local_198,iVar6);
          Imf_3_2::TiledOutputPart::copyPixels((TiledInputPart *)local_228);
        }
        else if ((__n == DAT_0010f428) &&
                ((__n == 0 ||
                 (iVar6 = bcmp(local_250._M_dataplus._M_p,Imf_3_2::SCANLINEIMAGE_abi_cxx11_,__n),
                 iVar6 == 0)))) {
          iVar6 = (int)local_230;
          Imf_3_2::InputPart::InputPart((InputPart *)&local_1d8,local_1b8,iVar6);
          Imf_3_2::OutputPart::OutputPart
                    ((OutputPart *)local_228,(MultiPartOutputFile *)&local_198,iVar6);
          Imf_3_2::OutputPart::copyPixels((InputPart *)local_228);
        }
        else if ((__n == DAT_0010f468) &&
                ((__n == 0 ||
                 (iVar6 = bcmp(local_250._M_dataplus._M_p,Imf_3_2::DEEPSCANLINE_abi_cxx11_,__n),
                 iVar6 == 0)))) {
          iVar6 = (int)local_230;
          Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
                    ((DeepScanLineInputPart *)&local_1d8,local_1b8,iVar6);
          Imf_3_2::DeepScanLineOutputPart::DeepScanLineOutputPart
                    ((DeepScanLineOutputPart *)local_228,(MultiPartOutputFile *)&local_198,iVar6);
          Imf_3_2::DeepScanLineOutputPart::copyPixels((DeepScanLineInputPart *)local_228);
        }
        else if ((__n == DAT_0010f488) &&
                ((__n == 0 ||
                 (iVar6 = bcmp(local_250._M_dataplus._M_p,Imf_3_2::DEEPTILE_abi_cxx11_,__n),
                 iVar6 == 0)))) {
          iVar6 = (int)local_230;
          Imf_3_2::DeepTiledInputPart::DeepTiledInputPart
                    ((DeepTiledInputPart *)&local_1d8,local_1b8,iVar6);
          Imf_3_2::DeepTiledOutputPart::DeepTiledOutputPart
                    ((DeepTiledOutputPart *)local_228,(MultiPartOutputFile *)&local_198,iVar6);
          Imf_3_2::DeepTiledOutputPart::copyPixels((DeepTiledInputPart *)local_228);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        Imf_3_2::Header::~Header((Header *)(local_228 + 0x18));
      }
      pcVar20 = local_230 + 1;
    } while (pcVar20 != local_1a8);
  }
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)&local_198);
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_1b8);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&local_178);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree(&local_e0);
  Imf_3_2::Header::~Header((Header *)local_158);
  Image::~Image(&local_70);
  Image::~Image(&local_b0);
  Image::~Image(&local_120);
  return;
}

Assistant:

void
makeTiled (
    const char         inFileName[],
    const char         outFileName[],
    int                partnum,
    LevelMode          mode,
    LevelRoundingMode  roundingMode,
    Compression        compression,
    int                tileSizeX,
    int                tileSizeY,
    const set<string>& doNotFilter,
    Extrapolation      extX,
    Extrapolation      extY,
    bool               verbose)
{
    Image          image0;
    Image          image1;
    Image          image2;
    Header         header;
    FrameBuffer    fb;
    vector<Header> headers;

    //
    // Load the input image
    //

    MultiPartInputFile input (inFileName);
    int                parts = input.parts ();

    for (int p = 0; p < parts; p++)
    {
        if (verbose) cout << "reading file " << inFileName << endl;

        if (p == partnum)
        {
            InputPart in (input, p);
            header = in.header ();
            if (hasEnvmap (header) && mode != ONE_LEVEL)
            {
                //
                // Proper low-pass filtering and subsampling
                // of environment maps is not implemented in
                // this program.
                //

                throw IEX_NAMESPACE::NoImplExc (
                    "This program cannot generate "
                    "multiresolution environment maps.  "
                    "Use exrenvmap instead.");
            }

            image0.resize (header.dataWindow ());

            for (ChannelList::ConstIterator i = header.channels ().begin ();
                 i != header.channels ().end ();
                 ++i)
            {
                const char*    name    = i.name ();
                const Channel& channel = i.channel ();

                if (channel.xSampling != 1 || channel.ySampling != 1)
                {
                    throw IEX_NAMESPACE::InputExc (
                        "Sub-sampled image channels are "
                        "not supported in tiled files.");
                }

                image0.addChannel (name, channel.type);
                image1.addChannel (name, channel.type);
                image2.addChannel (name, channel.type);
                fb.insert (name, image0.channel (name).slice ());
            }

            in.setFrameBuffer (fb);
            in.readPixels (
                header.dataWindow ().min.y, header.dataWindow ().max.y);

            //
            // Generate the header for the output file by modifying
            // the input file's header
            //

            header.setTileDescription (
                TileDescription (tileSizeX, tileSizeY, mode, roundingMode));

            header.compression () = compression;
            header.lineOrder ()   = INCREASING_Y;

            if (mode != ONE_LEVEL)
                addWrapmodes (
                    header, extToString (extX) + "," + extToString (extY));

            //
            // set tileDescription, type, and chunckcount for multipart
            //
            header.setType (TILEDIMAGE);
            int chunkcount = getChunkOffsetTableSize (header);
            header.setChunkCount (chunkcount);

            headers.push_back (header);
        }
        else
        {
            Header h = input.header (p);
            headers.push_back (h);
        }
    }

    //
    // Store the highest-resolution level of the image in the output file
    //

    MultiPartOutputFile output (outFileName, &headers[0], headers.size ());

    for (int p = 0; p < parts; p++)
    {
        if (p == partnum)
        {
            try
            {
                TiledOutputPart out (output, partnum);
                //    TiledOutputFile out (outFileName, header);

                out.setFrameBuffer (fb);

                if (verbose)
                    cout << "writing file " << outFileName
                         << "\n"
                            "level (0, 0)"
                         << endl;

                for (int y = 0; y < out.numYTiles (0); ++y)
                    for (int x = 0; x < out.numXTiles (0); ++x)
                        out.writeTile (x, y, 0);

                //
                // If necessary, generate the lower-resolution mipmap
                // or ripmap levels, and store them in the output file.
                //

                if (mode == MIPMAP_LEVELS)
                {
                    for (int l = 1; l < out.numLevels (); ++l)
                    {
                        image1.resize (out.dataWindowForLevel (l, l - 1));

                        reduceX (
                            header.channels (),
                            doNotFilter,
                            extX,
                            l & 1,
                            image0,
                            image1);

                        image0.resize (out.dataWindowForLevel (l, l));

                        reduceY (
                            header.channels (),
                            doNotFilter,
                            extY,
                            l & 1,
                            image1,
                            image0);

                        if (verbose)
                            cout << "level (" << l << ", " << l << ")" << endl;

                        storeLevel (out, header.channels (), l, l, image0);
                    }
                }

                if (mode == RIPMAP_LEVELS)
                {
                    Image* iptr0 = &image0;
                    Image* iptr1 = &image1;
                    Image* iptr2 = &image2;

                    for (int ly = 0; ly < out.numYLevels (); ++ly)
                    {
                        if (ly < out.numYLevels () - 1)
                        {
                            iptr2->resize (out.dataWindowForLevel (0, ly + 1));

                            reduceY (
                                header.channels (),
                                doNotFilter,
                                extY,
                                ly & 1,
                                *iptr0,
                                *iptr2);
                        }

                        for (int lx = 0; lx < out.numXLevels (); ++lx)
                        {
                            if (lx != 0 || ly != 0)
                            {
                                if (verbose)
                                    cout << "level (" << lx << ", " << ly << ")"
                                         << endl;

                                storeLevel (
                                    out, header.channels (), lx, ly, *iptr0);
                            }

                            if (lx < out.numXLevels () - 1)
                            {
                                iptr1->resize (
                                    out.dataWindowForLevel (lx + 1, ly));

                                reduceX (
                                    header.channels (),
                                    doNotFilter,
                                    extX,
                                    lx & 1,
                                    *iptr0,
                                    *iptr1);

                                swap (iptr0, iptr1);
                            }
                        }

                        swap (iptr2, iptr0);
                    }
                }
            }
            catch (const exception& e)
            {
                cerr << e.what () << endl;
            }
        }
        else
        {
            Header      header = headers[p];
            std::string type   = header.type ();
            if (type == TILEDIMAGE)
            {
                TiledInputPart  in (input, p);
                TiledOutputPart out (output, p);
                out.copyPixels (in);
            }
            else if (type == SCANLINEIMAGE)
            {
                using std::max;
                InputPart  in (input, p);
                OutputPart out (output, p);
                out.copyPixels (in);
            }
            else if (type == DEEPSCANLINE)
            {
                DeepScanLineInputPart  in (input, p);
                DeepScanLineOutputPart out (output, p);
                out.copyPixels (in);
            }
            else if (type == DEEPTILE)
            {
                DeepTiledInputPart  in (input, p);
                DeepTiledOutputPart out (output, p);
                out.copyPixels (in);
            }
        }
    }

    if (verbose) cout << "done." << endl;
}